

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

void __thiscall
CBlockPolicyEstimator::CBlockPolicyEstimator
          (CBlockPolicyEstimator *this,path *estimation_filepath,bool read_stale_estimates)

{
  _Rb_tree_header *p_Var1;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *this_00;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *this_01;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_04;
  iterator iVar2;
  _Head_base<0UL,_TxConfirmStats_*,_false> _Var3;
  pointer pcVar4;
  string_view source_file;
  bool bVar5;
  mapped_type_conflict2 *pmVar6;
  _Head_base<0UL,_TxConfirmStats_*,_false> _Var7;
  long lVar8;
  long lVar9;
  Logger *pLVar10;
  path *this_05;
  long *plVar11;
  long *in_R9;
  pointer __p;
  mapped_type_conflict2 mVar12;
  pointer *__ptr;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file_00;
  string_view source_file_01;
  string_view str;
  string_view logging_function_01;
  long local_130;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined8 local_108;
  long *local_f8 [2];
  long local_e8 [14];
  string local_78;
  double bucketBoundary;
  size_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CValidationInterface)._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_00b24900;
  this_05 = &this->m_estimation_filepath;
  std::filesystem::__cxx11::path::path(&this_05->super_path,&estimation_filepath->super_path);
  p_Var1 = &(this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header;
  mVar12 = 0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->nBestSeenHeight = 0;
  this->firstRecordedHeight = 0;
  this->historicalFirst = 0;
  this->historicalBest = 0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_00 = &this->feeStats;
  this_01 = &this->shortStats;
  this_02 = &this->longStats;
  this_03 = &this->buckets;
  this_04 = &this->bucketMap;
  p_Var1 = &(this->bucketMap)._M_t._M_impl.super__Rb_tree_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->feeStats)._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
  _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  (this->shortStats)._M_t.
  super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
  super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  (this->longStats)._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
  ._M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  this->trackedTxs = 0;
  this->untrackedTxs = 0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bucketBoundary = 1000.0;
  do {
    iVar2._M_current =
         (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)this_03,iVar2,&bucketBoundary);
    }
    else {
      *iVar2._M_current = bucketBoundary;
      (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    pmVar6 = std::
             map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
             ::operator[](this_04,&bucketBoundary);
    *pmVar6 = mVar12;
    bucketBoundary = bucketBoundary * 1.05;
    mVar12 = mVar12 + 1;
  } while (bucketBoundary <= 10000000.0);
  iVar2._M_current =
       (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_03,iVar2,&INF_FEERATE);
  }
  else {
    *iVar2._M_current = 1e+99;
    (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pmVar6 = std::
           map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
           ::operator[](this_04,&INF_FEERATE);
  *pmVar6 = mVar12;
  if ((this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    __assert_fail("bucketMap.size() == buckets.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                  ,0x227,
                  "CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path &, const bool)");
  }
  _Var7._M_head_impl = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(_Var7._M_head_impl,this_03,this_04,0x18,0.9952,2);
  bucketBoundary = 0.0;
  _Var3._M_head_impl =
       (this_00->_M_t).super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
       _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
       super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
  (this_00->_M_t).super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
  super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = _Var7._M_head_impl;
  if ((_Var3._M_head_impl != (TxConfirmStats *)0x0) &&
     (std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)this_00,_Var3._M_head_impl),
     bucketBoundary != 0.0)) {
    std::default_delete<TxConfirmStats>::operator()
              ((default_delete<TxConfirmStats> *)&bucketBoundary,(TxConfirmStats *)bucketBoundary);
  }
  _Var7._M_head_impl = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(_Var7._M_head_impl,this_03,this_04,0xc,0.962,1);
  bucketBoundary = 0.0;
  _Var3._M_head_impl =
       (this_01->_M_t).super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
       _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
       super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
  (this_01->_M_t).super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
  super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = _Var7._M_head_impl;
  if ((_Var3._M_head_impl != (TxConfirmStats *)0x0) &&
     (std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)this_01,_Var3._M_head_impl),
     bucketBoundary != 0.0)) {
    std::default_delete<TxConfirmStats>::operator()
              ((default_delete<TxConfirmStats> *)&bucketBoundary,(TxConfirmStats *)bucketBoundary);
  }
  _Var7._M_head_impl = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(_Var7._M_head_impl,this_03,this_04,0x2a,0.99931,0x18);
  bucketBoundary = 0.0;
  _Var3._M_head_impl =
       (this_02->_M_t).super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
       _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
       super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
  (this_02->_M_t).super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
  super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = _Var7._M_head_impl;
  if ((_Var3._M_head_impl != (TxConfirmStats *)0x0) &&
     (std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)this_02,_Var3._M_head_impl),
     bucketBoundary != 0.0)) {
    std::default_delete<TxConfirmStats>::operator()
              ((default_delete<TxConfirmStats> *)&bucketBoundary,(TxConfirmStats *)bucketBoundary);
  }
  local_128._8_8_ = fsbridge::fopen((char *)this_05,"rb");
  local_118._M_allocated_capacity = 0;
  local_118._8_8_ = 0;
  local_108 = 0;
  if ((FILE *)local_128._8_8_ == (FILE *)0x0) {
    pcVar4 = (this->m_estimation_filepath).super_path._M_pathname._M_dataplus._M_p;
    bucketBoundary = (double)&local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bucketBoundary,pcVar4,
               pcVar4 + (this->m_estimation_filepath).super_path._M_pathname._M_string_length);
    logging_function_00._M_str = "CBlockPolicyEstimator";
    logging_function_00._M_len = 0x15;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp";
    source_file_01._M_len = 0x58;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_01,0x230,ALL,Info,
               "%s is not found. Continue anyway.\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bucketBoundary)
    ;
LAB_0027e7f3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bucketBoundary == &local_48) goto LAB_0027e872;
    local_e8[0] = CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]);
    plVar11 = (long *)bucketBoundary;
  }
  else {
    lVar8 = std::filesystem::last_write_time((path *)this_05);
    lVar9 = std::chrono::_V2::system_clock::now();
    if ((lVar9 - lVar8) + 0x26a8d2b340ae0000U < 0x8000c7b99bfe2000 || read_stale_estimates) {
      bVar5 = Read(this,(AutoFile *)(local_128 + 8));
      if (bVar5) goto LAB_0027e872;
      pcVar4 = (this->m_estimation_filepath).super_path._M_pathname._M_dataplus._M_p;
      bucketBoundary = (double)&local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&bucketBoundary,pcVar4,
                 pcVar4 + (this->m_estimation_filepath).super_path._M_pathname._M_string_length);
      logging_function._M_str = "CBlockPolicyEstimator";
      logging_function._M_len = 0x15;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file_00._M_len = 0x58;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file_00,0x23b,ALL,Info,
                 "Failed to read fee estimates from %s. Continue anyway.\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &bucketBoundary);
      goto LAB_0027e7f3;
    }
    pcVar4 = (this->m_estimation_filepath).super_path._M_pathname._M_dataplus._M_p;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,pcVar4,
               pcVar4 + (this->m_estimation_filepath).super_path._M_pathname._M_string_length);
    local_128._0_8_ = ((lVar9 - lVar8) + -0x59572d4cbf520000) / 3600000000000;
    local_130 = 0x3c;
    pLVar10 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar10);
    if (bVar5) {
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      bucketBoundary = (double)&local_48;
      tinyformat::format<std::__cxx11::string,long,long>
                (&local_78,
                 (tinyformat *)
                 "Fee estimation file %s too old (age=%lld > %lld hours) and will not be used to avoid serving stale estimates.\n"
                 ,(char *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                 &local_130,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &bucketBoundary,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar10 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x58;
      local_78._M_string_length = 0x81cc4d;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = (char *)bucketBoundary;
      str._M_len = local_50;
      logging_function_01._M_str = "CBlockPolicyEstimator";
      logging_function_01._M_len = 0x15;
      BCLog::Logger::LogPrintStr(pLVar10,str,logging_function_01,source_file,0x236,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)bucketBoundary != &local_48) {
        operator_delete((void *)bucketBoundary,
                        CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
        ;
      }
    }
    plVar11 = local_f8[0];
    if (local_f8[0] == local_e8) goto LAB_0027e872;
  }
  operator_delete(plVar11,local_e8[0] + 1);
LAB_0027e872:
  AutoFile::~AutoFile((AutoFile *)(local_128 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path& estimation_filepath, const bool read_stale_estimates)
    : m_estimation_filepath{estimation_filepath}
{
    static_assert(MIN_BUCKET_FEERATE > 0, "Min feerate must be nonzero");
    size_t bucketIndex = 0;

    for (double bucketBoundary = MIN_BUCKET_FEERATE; bucketBoundary <= MAX_BUCKET_FEERATE; bucketBoundary *= FEE_SPACING, bucketIndex++) {
        buckets.push_back(bucketBoundary);
        bucketMap[bucketBoundary] = bucketIndex;
    }
    buckets.push_back(INF_FEERATE);
    bucketMap[INF_FEERATE] = bucketIndex;
    assert(bucketMap.size() == buckets.size());

    feeStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
    shortStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
    longStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));

    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "rb")};

    if (est_file.IsNull()) {
        LogPrintf("%s is not found. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
        return;
    }

    std::chrono::hours file_age = GetFeeEstimatorFileAge();
    if (file_age > MAX_FILE_AGE && !read_stale_estimates) {
        LogPrintf("Fee estimation file %s too old (age=%lld > %lld hours) and will not be used to avoid serving stale estimates.\n", fs::PathToString(m_estimation_filepath), Ticks<std::chrono::hours>(file_age), Ticks<std::chrono::hours>(MAX_FILE_AGE));
        return;
    }

    if (!Read(est_file)) {
        LogPrintf("Failed to read fee estimates from %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    }
}